

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::PlotDataContainer::CalculateYRangePlot
          (PlotDataContainer *this,float inXMin,float inXMax,PlotDataBase *inXData,
          PlotDataBase *inYData,float *outYMin,float *outYMax)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float theY;
  float theX;
  long theI;
  bool initialized;
  float *outYMax_local;
  float *outYMin_local;
  PlotDataBase *inYData_local;
  PlotDataBase *inXData_local;
  float inXMax_local;
  float inXMin_local;
  PlotDataContainer *this_local;
  
  *outYMin = 0.0;
  *outYMax = 0.0;
  bVar1 = false;
  lVar2 = PlotDataBase::GetSize(inXData);
  lVar3 = PlotDataBase::GetSize(inYData);
  if (lVar2 == lVar3) {
    for (_theY = 0; lVar2 = PlotDataBase::GetSize(inXData), _theY < lVar2; _theY = _theY + 1) {
      fVar4 = PlotDataBase::GetValue(inXData,_theY);
      fVar5 = PlotDataBase::GetValue(inYData,_theY);
      if ((inXMin <= fVar4) && (fVar4 <= inXMax)) {
        if (bVar1) {
          if (fVar5 < *outYMin) {
            *outYMin = fVar5;
          }
          if (*outYMax <= fVar5 && fVar5 != *outYMax) {
            *outYMax = fVar5;
          }
        }
        else {
          bVar1 = true;
          *outYMin = fVar5;
          *outYMax = fVar5;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PlotDataContainer::CalculateYRangePlot (float inXMin, float inXMax, const PlotDataBase &inXData, const PlotDataBase &inYData, float &outYMin, float &outYMax) const {
        outYMin = 0;
        outYMax = 0;
        // bool theEnteredXRange = false;
        bool initialized = false;
        
        if (inXData.GetSize () != inYData.GetSize ()) {
            return false;
        }

        for (long theI = 0; theI < inXData.GetSize (); theI++) {
            float theX = inXData.GetValue (theI);
            float theY = inYData.GetValue (theI);
            
            if (theX>=inXMin && theX <= inXMax) {
                if (!initialized) {
                    initialized = true;
                    outYMin = theY;
                    outYMax = theY;
                } else {
                    if (theY<outYMin) {
                        outYMin = theY;
                    }
                    if (theY>outYMax) {
                        outYMax = theY;
                    }
                }
            }
        }
        return true;
    }